

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeKernelGetSourceAttributes(ze_kernel_handle_t hKernel,uint32_t *pSize,char **pString)

{
  ze_pfnKernelGetSourceAttributes_t pfnGetSourceAttributes;
  dditable_t *dditable;
  ze_result_t result;
  char **pString_local;
  uint32_t *pSize_local;
  ze_kernel_handle_t hKernel_local;
  
  if (*(code **)(*(long *)(hKernel + 8) + 0x598) == (code *)0x0) {
    hKernel_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hKernel_local._4_4_ =
         (**(code **)(*(long *)(hKernel + 8) + 0x598))(*(undefined8 *)hKernel,pSize,pString);
  }
  return hKernel_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelGetSourceAttributes(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t* pSize,                                ///< [in,out] pointer to size of string in bytes, including
                                                        ///< null-terminating character.
        char** pString                                  ///< [in,out][optional] pointer to application-managed character array
                                                        ///< (string data).
                                                        ///< If NULL, the string length of the kernel source attributes, including
                                                        ///< a null-terminating character, is returned in pSize. Otherwise, pString
                                                        ///< must point to valid application memory that is greater than or equal
                                                        ///< to *pSize bytes in length, and on return the pointed-to string will
                                                        ///< contain a space-separated list of kernel source attributes. Note: This
                                                        ///< API was originally intended to ship with a char *pString, however this
                                                        ///< typo was introduced. Thus the API has to stay this way for backwards
                                                        ///< compatible reasons. It can be corrected in v2.0. Suggestion is to
                                                        ///< create your own char *pString and then pass to this API with &pString.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_kernel_object_t*>( hKernel )->dditable;
        auto pfnGetSourceAttributes = dditable->ze.Kernel.pfnGetSourceAttributes;
        if( nullptr == pfnGetSourceAttributes )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hKernel = reinterpret_cast<ze_kernel_object_t*>( hKernel )->handle;

        // forward to device-driver
        result = pfnGetSourceAttributes( hKernel, pSize, pString );

        return result;
    }